

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError Pm_SetFilter(PortMidiStream *stream,int32_t filters)

{
  PmError local_24;
  PmError err;
  PmInternal *midi;
  int32_t filters_local;
  PortMidiStream *stream_local;
  
  local_24 = pmNoData;
  if (stream == (PortMidiStream *)0x0) {
    local_24 = pmBadPtr;
  }
  else if (descriptors[*stream].pub.opened == 0) {
    local_24 = pmBadPtr;
  }
  else {
    *(int32_t *)((long)stream + 0x38) = filters;
  }
  return local_24;
}

Assistant:

PMEXPORT PmError Pm_SetFilter(PortMidiStream *stream, int32_t filters) {
    PmInternal *midi = (PmInternal *) stream;
    PmError err = pmNoError;

    /* arg checking */
    if (midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else
        midi->filters = filters;
    return pm_errmsg(err);
}